

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.h
# Opt level: O1

string * DeploymentName_abi_cxx11_(string *__return_storage_ptr__,BuriedDeployment dep)

{
  long lVar1;
  char *pcVar2;
  undefined6 in_register_00000032;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (-0x7ffc < (int)CONCAT62(in_register_00000032,dep)) {
    __assert_fail("ValidDeployment(dep)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/deploymentinfo.cpp"
                  ,0x18,"std::string DeploymentName(Consensus::BuriedDeployment)");
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(dep) {
  case 0xffff8000:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_00d7db53:
      __stack_chk_fail();
    }
    pcVar3 = "bip34";
    pcVar2 = "";
    break;
  case 0xffff8001:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00d7db53;
    pcVar3 = "bip65";
    pcVar2 = "";
    break;
  case 0xffff8002:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00d7db53;
    pcVar3 = "bip66";
    pcVar2 = "";
    break;
  case 0xffff8003:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00d7db53;
    pcVar3 = "csv";
    pcVar2 = "";
    break;
  case 0xffff8004:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00d7db53;
    pcVar3 = "segwit";
    pcVar2 = "";
    break;
  default:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00d7db53;
    pcVar2 = "";
    pcVar3 = pcVar2;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

constexpr bool ValidDeployment(BuriedDeployment dep) { return dep <= DEPLOYMENT_SEGWIT; }